

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion32
          (CollationDataBuilder *this,int32_t *newCE32s,int32_t length,UErrorCode *errorCode)

{
  int iVar1;
  int32_t *piVar2;
  UBool UVar3;
  uint uVar4;
  int iVar5;
  int32_t *piVar6;
  int32_t iVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar1 = (this->ce32s).count;
  if (length <= iVar1) {
    piVar2 = (this->ce32s).elements;
    uVar9 = 0;
    piVar6 = piVar2;
    do {
      iVar7 = 0;
      if ((long)uVar9 < (long)iVar1) {
        iVar7 = piVar2[uVar9];
      }
      if (*newCE32s == iVar7) {
        if (0x7ffff < uVar9) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          return 0;
        }
        if (length == 1) {
LAB_002327ef:
          return length << 8 | (int)uVar9 << 0xd | 0xc5;
        }
        uVar8 = 1;
        while( true ) {
          iVar7 = 0;
          if ((int)uVar9 + (int)uVar8 < iVar1) {
            iVar7 = piVar6[uVar8];
          }
          if (iVar7 != newCE32s[uVar8]) break;
          uVar8 = uVar8 + 1;
          if ((uint)length == uVar8) goto LAB_002327ef;
        }
      }
      uVar9 = uVar9 + 1;
      piVar6 = piVar6 + 1;
    } while (uVar9 != (iVar1 - length) + 1);
  }
  if (iVar1 < 0x80000) {
    if (0 < length) {
      uVar9 = 0;
      do {
        iVar7 = newCE32s[uVar9];
        iVar5 = (this->ce32s).count;
        if ((iVar5 < -1) || ((this->ce32s).capacity <= iVar5)) {
          UVar3 = UVector32::expandCapacity(&this->ce32s,iVar5 + 1,errorCode);
          if (UVar3 != '\0') {
            iVar5 = (this->ce32s).count;
            goto LAB_0023284f;
          }
        }
        else {
LAB_0023284f:
          (this->ce32s).elements[iVar5] = iVar7;
          piVar2 = &(this->ce32s).count;
          *piVar2 = *piVar2 + 1;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)length != uVar9);
    }
    uVar4 = length << 8 | iVar1 << 0xd | 0xc5;
  }
  else {
    *errorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return uVar4;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion32(const int32_t newCE32s[], int32_t length,
                                        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CE32s has already been stored.
    int32_t first = newCE32s[0];
    int32_t ce32sMax = ce32s.size() - length;
    for(int32_t i = 0; i <= ce32sMax; ++i) {
        if(first == ce32s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION32_TAG, i, length);
                }
                if(ce32s.elementAti(i + j) != newCE32s[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce32s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce32s.addElement(newCE32s[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION32_TAG, i, length);
}